

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O1

bool __thiscall
wallet::WalletBatch::EraseRecords
          (WalletBatch *this,
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *types)

{
  bool bVar1;
  function<bool_(wallet::WalletBatch_&)> *in_R8;
  long in_FS_OFFSET;
  string_view process_desc;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  undefined8 uStack_30;
  code *local_28;
  code *pcStack_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  uStack_30 = 0;
  pcStack_20 = std::
               _Function_handler<bool_(wallet::WalletBatch_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1338:49)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(wallet::WalletBatch_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1338:49)>
             ::_M_manager;
  process_desc._M_str = (char *)&local_38;
  process_desc._M_len = (size_t)"erase records";
  local_38 = types;
  bVar1 = RunWithinTxn((wallet *)this,(WalletBatch *)0xd,process_desc,in_R8);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::EraseRecords(const std::unordered_set<std::string>& types)
{
    return RunWithinTxn(*this, "erase records", [&types](WalletBatch& self) {
        return std::all_of(types.begin(), types.end(), [&self](const std::string& type) {
            return self.m_batch->ErasePrefix(DataStream() << type);
        });
    });
}